

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::RboStateQueryTests::init(RboStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ApiCase *pAVar1;
  
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"renderbuffer_size",
                   "RENDERBUFFER_WIDTH and RENDERBUFFER_HEIGHT");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e3eb18;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"renderbuffer_internal_format",
                   "RENDERBUFFER_INTERNAL_FORMAT");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e3eb70;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"renderbuffer_component_size_color",
                   "RENDERBUFFER_x_SIZE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e3ebc8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"renderbuffer_component_size_depth",
                   "RENDERBUFFER_x_SIZE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e3ec20;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"renderbuffer_samples",
                   "RENDERBUFFER_SAMPLES");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e3ec78;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  return extraout_EAX;
}

Assistant:

void RboStateQueryTests::init (void)
{
	addChild(new RboSizeCase				(m_context, "renderbuffer_size",					"RENDERBUFFER_WIDTH and RENDERBUFFER_HEIGHT"));
	addChild(new RboInternalFormatCase		(m_context, "renderbuffer_internal_format",			"RENDERBUFFER_INTERNAL_FORMAT"));
	addChild(new RboComponentSizeColorCase	(m_context, "renderbuffer_component_size_color",	"RENDERBUFFER_x_SIZE"));
	addChild(new RboComponentSizeDepthCase	(m_context, "renderbuffer_component_size_depth",	"RENDERBUFFER_x_SIZE"));
	addChild(new RboSamplesCase				(m_context, "renderbuffer_samples",					"RENDERBUFFER_SAMPLES"));
}